

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

int getPixelOverflowTC(gdImagePtr im,int x,int y,int bgColor)

{
  int iVar1;
  
  iVar1 = gdImageBoundsSafe(im,x,y);
  if (iVar1 != 0) {
    iVar1 = 0x7f000000;
    if (bgColor != -1) {
      iVar1 = bgColor;
    }
    bgColor = iVar1;
    if (im->tpixels[y][x] != im->transparent) {
      bgColor = im->tpixels[y][x];
    }
  }
  return bgColor;
}

Assistant:

static inline int getPixelOverflowTC(gdImagePtr im, const int x, const int y, const int bgColor)
{
	if (gdImageBoundsSafe(im, x, y)) {
		const int c = im->tpixels[y][x];
		if (c == im->transparent) {
			return bgColor == -1 ? gdTrueColorAlpha(0, 0, 0, 127) : bgColor;
		}
		return c;
	} else {
		return bgColor;
	}
}